

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

void __thiscall depspawn::internal::TaskPool::launch_threads(TaskPool *this)

{
  int iVar1;
  ThreadPool *in_RDI;
  memory_order __b;
  ThreadPool *pTVar2;
  ThreadPool *this_00;
  
  if ((in_RDI[3].mutex_.super___mutex_base._M_mutex.__size[0x10] & 1U) != 0) {
    pTVar2 = (ThreadPool *)((long)&in_RDI[3].mutex_.super___mutex_base._M_mutex + 0x14);
    iVar1 = ThreadPool::nthreads(in_RDI);
    this_00 = pTVar2;
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    *(int *)&(pTVar2->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start = iVar1;
    UNLOCK();
    in_RDI[3].mutex_.super___mutex_base._M_mutex.__size[0x10] = '\0';
    ThreadPool::launch_theads(this_00);
  }
  return;
}

Assistant:

void launch_threads()
  {
    if(finish_) {
      busy_threads_.store(thread_pool_.nthreads());
      finish_ = false;
      thread_pool_.launch_theads();
    }
  }